

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-expression.c
# Opt level: O0

_Bool expression_test_copy(expression_t *a,expression_t *b)

{
  ulong uStack_28;
  _Bool success;
  size_t i;
  expression_t *b_local;
  expression_t *a_local;
  
  if ((a == (expression_t *)0x0) || (b == (expression_t *)0x0)) {
    a_local._7_1_ = false;
  }
  else {
    a_local._7_1_ =
         (((a != b && a->base_value == b->base_value) && a->operation_count == b->operation_count)
         && a->operations_size == b->operations_size) && a->operations != b->operations;
    if (a->operation_count == b->operation_count) {
      for (uStack_28 = 0; uStack_28 < a->operation_count; uStack_28 = uStack_28 + 1) {
        a_local._7_1_ =
             (a_local._7_1_ & a->operations[uStack_28].operand == b->operations[uStack_28].operand &
             a->operations[uStack_28].operator == b->operations[uStack_28].operator) != 0;
      }
    }
    else {
      a_local._7_1_ = false;
    }
  }
  return a_local._7_1_;
}

Assistant:

bool expression_test_copy(const expression_t *a, const expression_t *b)
{
	size_t i;
	bool success = true;

	if (a == NULL || b == NULL)
		return false;

	success &= (a != b);
	success &= (a->base_value == b->base_value);
	success &= (a->operation_count == b->operation_count);
	success &= (a->operations_size == b->operations_size);
	success &= (a->operations != b->operations);

	if (a->operation_count != b->operation_count)
		return false;

	for (i = 0; i < a->operation_count; i++) {
		success &= (a->operations[i].operand == b->operations[i].operand);
		success &= (a->operations[i].operator == b->operations[i].operator);
	}

	return success;
}